

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_DDict *
ZSTD_initStaticDDict
          (void *sBuffer,size_t sBufferSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType)

{
  uint uVar1;
  size_t in_RCX;
  ZSTD_DDict *in_RDX;
  ulong in_RSI;
  ZSTD_DDict *in_RDI;
  int in_R8D;
  ZSTD_DDict *ddict;
  size_t neededSpace;
  size_t local_48;
  ZSTD_DDict *dict_00;
  ZSTD_DDict *in_stack_fffffffffffffff8;
  
  local_48 = in_RCX;
  if (in_R8D == 1) {
    local_48 = 0;
  }
  if (in_RDI == (ZSTD_DDict *)0x0) {
    __assert_fail("sBuffer != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9acf,
                  "const ZSTD_DDict *ZSTD_initStaticDDict(void *, size_t, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e)"
                 );
  }
  if (in_RDX == (ZSTD_DDict *)0x0) {
    __assert_fail("dict != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9ad0,
                  "const ZSTD_DDict *ZSTD_initStaticDDict(void *, size_t, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e)"
                 );
  }
  if (((ulong)in_RDI & 7) == 0) {
    if (in_RSI < local_48 + 0x6ad8) {
      in_RDI = (ZSTD_DDict *)0x0;
    }
    else {
      dict_00 = in_RDI;
      if (in_R8D == 0) {
        memcpy(in_RDI + 1,in_RDX,in_RCX);
        in_RDX = in_RDI + 1;
      }
      ZSTD_initDDict_internal
                (in_stack_fffffffffffffff8,dict_00,in_RSI,
                 (ZSTD_dictLoadMethod_e)((ulong)in_RDX >> 0x20),(ZSTD_dictContentType_e)in_RDX);
      uVar1 = ZSTD_isError(0x2f2951);
      if (uVar1 != 0) {
        in_RDI = (ZSTD_DDict *)0x0;
      }
    }
  }
  else {
    in_RDI = (ZSTD_DDict *)0x0;
  }
  return in_RDI;
}

Assistant:

const ZSTD_DDict* ZSTD_initStaticDDict(
                                void* sBuffer, size_t sBufferSize,
                                const void* dict, size_t dictSize,
                                ZSTD_dictLoadMethod_e dictLoadMethod,
                                ZSTD_dictContentType_e dictContentType)
{
    size_t const neededSpace = sizeof(ZSTD_DDict)
                             + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize);
    ZSTD_DDict* const ddict = (ZSTD_DDict*)sBuffer;
    assert(sBuffer != NULL);
    assert(dict != NULL);
    if ((size_t)sBuffer & 7) return NULL;   /* 8-aligned */
    if (sBufferSize < neededSpace) return NULL;
    if (dictLoadMethod == ZSTD_dlm_byCopy) {
        ZSTD_memcpy(ddict+1, dict, dictSize);  /* local copy */
        dict = ddict+1;
    }
    if (ZSTD_isError( ZSTD_initDDict_internal(ddict,
                                              dict, dictSize,
                                              ZSTD_dlm_byRef, dictContentType) ))
        return NULL;
    return ddict;
}